

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *
remap_pls(vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
          *__return_storage_ptr__,SmallVector<PLSArg,_8UL> *pls_variables,
         SmallVector<spirv_cross::Resource,_8UL> *resources,
         SmallVector<spirv_cross::Resource,_8UL> *secondary_resources)

{
  pointer *ppPVar1;
  size_t sVar2;
  Resource *pRVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  PlsRemap in_RAX;
  PlsRemap extraout_RAX;
  PlsRemap extraout_RAX_00;
  PlsRemap extraout_RAX_01;
  iterator __position;
  long *in_R8;
  long lVar7;
  long lVar8;
  PlsRemap local_50;
  long *local_48;
  SmallVector<spirv_cross::Resource,_8UL> *local_40;
  SmallVector<PLSArg,_8UL> *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (resources != (SmallVector<spirv_cross::Resource,_8UL> *)0x0) {
    local_38 = (SmallVector<PLSArg,_8UL> *)
               ((pls_variables->stack_storage).aligned_char + (long)resources * 0x28 + -0x18);
    local_48 = in_R8;
    local_40 = secondary_resources;
    do {
      sVar2 = (local_40->super_VectorView<spirv_cross::Resource>).buffer_size;
      if (sVar2 != 0) {
        pRVar3 = (local_40->super_VectorView<spirv_cross::Resource>).ptr;
        sVar4 = pls_variables->buffer_capacity;
        lVar7 = 0;
        do {
          if ((*(size_t *)((long)&(pRVar3->name)._M_string_length + lVar7) == sVar4) &&
             ((sVar4 == 0 ||
              (iVar6 = bcmp(*(void **)((long)&(pRVar3->name)._M_dataplus._M_p + lVar7),
                            (void *)(pls_variables->super_VectorView<PLSArg>).buffer_size,sVar4),
              iVar6 == 0)))) {
            local_50.id = *(uint32_t *)((long)&(pRVar3->id).id + lVar7);
            local_50.format = *(PlsFormat *)&(pls_variables->super_VectorView<PLSArg>).ptr;
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current !=
                (__return_storage_ptr__->
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) goto LAB_00116a01;
            std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
            _M_realloc_insert<spirv_cross::PlsRemap>(__return_storage_ptr__,__position,&local_50);
            in_RAX = extraout_RAX_01;
            goto LAB_00116a0e;
          }
          lVar7 = lVar7 + 0x30;
        } while (sVar2 * 0x30 != lVar7);
      }
      if ((local_48 != (long *)0x0) && (lVar7 = local_48[1], lVar7 != 0)) {
        lVar5 = *local_48;
        sVar4 = pls_variables->buffer_capacity;
        lVar8 = 0;
        do {
          if ((*(size_t *)(lVar5 + 0x18 + lVar8) == sVar4) &&
             ((sVar4 == 0 ||
              (iVar6 = bcmp(*(void **)(lVar5 + 0x10 + lVar8),
                            (void *)(pls_variables->super_VectorView<PLSArg>).buffer_size,sVar4),
              iVar6 == 0)))) {
            local_50.id = *(uint32_t *)(lVar5 + lVar8);
            local_50.format = *(PlsFormat *)&(pls_variables->super_VectorView<PLSArg>).ptr;
            __position._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>::
              _M_realloc_insert<spirv_cross::PlsRemap>(__return_storage_ptr__,__position,&local_50);
              in_RAX = extraout_RAX_00;
            }
            else {
LAB_00116a01:
              in_RAX.format = local_50.format;
              in_RAX.id = local_50.id;
              *__position._M_current = in_RAX;
              ppPVar1 = &(__return_storage_ptr__->
                         super__Vector_base<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *ppPVar1 = *ppPVar1 + 1;
            }
            goto LAB_00116a0e;
          }
          lVar8 = lVar8 + 0x30;
        } while (lVar7 * 0x30 != lVar8);
      }
      remap_pls();
      in_RAX = extraout_RAX;
LAB_00116a0e:
      pls_variables =
           (SmallVector<PLSArg,_8UL> *)((pls_variables->stack_storage).aligned_char + 0x10);
    } while (pls_variables != local_38);
  }
  return (vector<spirv_cross::PlsRemap,_std::allocator<spirv_cross::PlsRemap>_> *)in_RAX;
}

Assistant:

static vector<PlsRemap> remap_pls(const SmallVector<PLSArg> &pls_variables, const SmallVector<Resource> &resources,
                                  const SmallVector<Resource> *secondary_resources)
{
	vector<PlsRemap> ret;

	for (auto &pls : pls_variables)
	{
		bool found = false;
		for (auto &res : resources)
		{
			if (res.name == pls.name)
			{
				ret.push_back({ res.id, pls.format });
				found = true;
				break;
			}
		}

		if (!found && secondary_resources)
		{
			for (auto &res : *secondary_resources)
			{
				if (res.name == pls.name)
				{
					ret.push_back({ res.id, pls.format });
					found = true;
					break;
				}
			}
		}

		if (!found)
			fprintf(stderr, "Did not find stage input/output/target with name \"%s\".\n", pls.name.c_str());
	}

	return ret;
}